

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O0

MMDB_entry_data_list_s * test_boolean_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  MMDB_entry_data_list_s *value;
  MMDB_entry_data_list_s *entry_data_list_local;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x2e,(pMVar1->entry_data).type,"==",0xe,"\'boolean\' key\'s value is a boolean",0);
  ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
            ,0x2f,(pMVar1->entry_data).field_1.boolean & 1,"\'boolean\' key\'s value is true",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_boolean_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_BOOLEAN,
           "'boolean' key's value is a boolean");
    ok(value->entry_data.boolean, "'boolean' key's value is true");

    return entry_data_list;
}